

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * __thiscall
lest::to_string<Implicit,Implicit>
          (string *__return_storage_ptr__,lest *this,Implicit *lhs,string *op,Implicit *rhs)

{
  ostream *poVar1;
  ostringstream os;
  ForStreamable<Implicit,_std::string> FStack_1d8;
  ForStreamable<Implicit,_std::string> local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  make_string<Implicit>(&local_1b8,(Implicit *)this);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  make_string<Implicit>(&FStack_1d8,(Implicit *)op);
  std::operator<<(poVar1,(string *)&FStack_1d8);
  std::__cxx11::string::~string((string *)&FStack_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}